

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O3

void __thiscall Glucose::Solver::detachClausePurgatory(Solver *this,CRef cr,bool strict)

{
  vec<Glucose::Solver::Watcher> *pvVar1;
  uint *puVar2;
  vec<Glucose::Solver::Watcher> *pvVar3;
  char *pcVar4;
  int iVar5;
  ulong uVar6;
  undefined7 in_register_00000011;
  Lit local_4;
  
  puVar2 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
  if ((int)CONCAT71(in_register_00000011,strict) == 0) {
    uVar6 = (long)(int)puVar2[(ulong)cr + 3] ^ 1;
    pcVar4 = (this->unaryWatches).dirty.data;
    if (pcVar4[uVar6] == '\0') {
      pcVar4[uVar6] = '\x01';
      vec<Glucose::Lit>::push(&(this->unaryWatches).dirties,&local_4);
    }
  }
  else {
    uVar6 = (long)(int)puVar2[(ulong)cr + 3] ^ 1;
    pvVar3 = (this->unaryWatches).occs.data;
    pvVar1 = pvVar3 + uVar6;
    iVar5 = pvVar3[uVar6].sz;
    if ((long)iVar5 < 1) {
      uVar6 = 0;
LAB_0010c1db:
      iVar5 = iVar5 + -1;
      if ((int)uVar6 < iVar5) {
        uVar6 = uVar6 & 0xffffffff;
        do {
          pvVar1->data[uVar6] = pvVar1->data[uVar6 + 1];
          uVar6 = uVar6 + 1;
          iVar5 = pvVar1->sz + -1;
        } while ((int)uVar6 < iVar5);
      }
    }
    else {
      uVar6 = 0;
      do {
        if (pvVar1->data[uVar6].cref == cr) goto LAB_0010c1db;
        uVar6 = uVar6 + 1;
      } while ((long)iVar5 != uVar6);
      iVar5 = iVar5 + -1;
    }
    pvVar1->sz = iVar5;
  }
  return;
}

Assistant:

void Solver::detachClausePurgatory(CRef cr, bool strict) {
    const Clause &c = ca[cr];

    assert(c.size() > 1);
    if(strict)
        remove(unaryWatches[~c[0]], Watcher(cr, c[1]));
    else
        unaryWatches.smudge(~c[0]);
}